

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O2

void __thiscall
pstore::region::region_builder<pstore::file::in_memory,_pstore::in_memory_mapper>::
check_regions_are_contiguous
          (region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> *this,
          container_type *regions)

{
  element_type *peVar1;
  pointer psVar2;
  uint64_t uVar3;
  
  psVar2 = (regions->
           super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = 0;
  while( true ) {
    if (psVar2 == (regions->
                  super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    peVar1 = (psVar2->super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (peVar1->offset_ != uVar3) break;
    uVar3 = uVar3 + peVar1->size_;
    psVar2 = psVar2 + 1;
  }
  assert_failed("region->offset () == p",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                ,0xb4);
}

Assistant:

void region_builder<File, MemoryMapper>::check_regions_are_contiguous (
            container_type const & regions) {
#ifdef NDEBUG
            (void) regions;
#else
            // Check that the regions are contiguous and sorted.
            std::uint64_t p = 0;
            for (pstore::region::memory_mapper_ptr const & region : regions) {
                PSTORE_ASSERT (region->offset () == p);
                p += region->size ();
            }
#endif
        }